

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int termCanDriveIndex(WhereTerm *pTerm,SrcList_item *pSrc,Bitmask notReady)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  
  if (((pTerm->leftCursor == pSrc->iCursor) && ((pTerm->eOperator & 2) != 0)) &&
     ((pTerm->prereqRight & notReady) == 0)) {
    cVar1 = pSrc->pTab->aCol[(pTerm->u).leftColumn].affinity;
    cVar2 = comparisonAffinity(pTerm->pExpr);
    if (cVar2 == 'b') {
      bVar3 = true;
    }
    else if (cVar2 == 'a') {
      bVar3 = cVar1 == 'a';
    }
    else {
      bVar3 = 'b' < cVar1;
    }
    return (int)bVar3;
  }
  return 0;
}

Assistant:

static int termCanDriveIndex(
  WhereTerm *pTerm,              /* WHERE clause term to check */
  struct SrcList_item *pSrc,     /* Table we are trying to access */
  Bitmask notReady               /* Tables in outer loops of the join */
){
  char aff;
  if( pTerm->leftCursor!=pSrc->iCursor ) return 0;
  if( (pTerm->eOperator & WO_EQ)==0 ) return 0;
  if( (pTerm->prereqRight & notReady)!=0 ) return 0;
  aff = pSrc->pTab->aCol[pTerm->u.leftColumn].affinity;
  if( !sqlite3IndexAffinityOk(pTerm->pExpr, aff) ) return 0;
  return 1;
}